

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall google::protobuf::io::ArrayInputStream::Skip(ArrayInputStream *this,int count)

{
  int iVar1;
  LogMessage *other;
  int iVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x5e);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->last_returned_size_ = 0;
  iVar1 = this->size_ - this->position_;
  iVar2 = this->position_ + count;
  if (iVar1 < count) {
    iVar2 = this->size_;
  }
  this->position_ = iVar2;
  return count <= iVar1;
}

Assistant:

bool ArrayInputStream::Skip(int count) {
  GOOGLE_CHECK_GE(count, 0);
  last_returned_size_ = 0;   // Don't let caller back up.
  if (count > size_ - position_) {
    position_ = size_;
    return false;
  } else {
    position_ += count;
    return true;
  }
}